

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool cinemo::getWaveFiles
               (string *dir,
               vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *workFiles)

{
  bool bVar1;
  DIR *__dirp;
  dirent *pdVar2;
  LameWrapper *this;
  allocator local_61;
  vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *local_60;
  LameWrapper *local_58;
  string local_50;
  
  local_60 = (vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *)workFiles;
  __dirp = opendir((dir->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    bVar1 = false;
  }
  else {
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      std::__cxx11::string::string((string *)&local_50,pdVar2->d_name,(allocator *)&local_58);
      bVar1 = isValidFileType(&local_50,"wav");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        this = (LameWrapper *)operator_new(0x90);
        std::__cxx11::string::string((string *)&local_50,pdVar2->d_name,&local_61);
        LameWrapper::LameWrapper(this,dir,&local_50);
        local_58 = this;
        std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>::
        emplace_back<cinemo::LameWrapper*>(local_60,&local_58);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    bVar1 = *(pointer *)(local_60 + 8) != *(pointer *)local_60;
  }
  return bVar1;
}

Assistant:

bool getWaveFiles(const string& dir, vector<LameWrapper*>& workFiles) {
        DIR* workDir = opendir(dir.c_str());
        if (workDir == nullptr) {
            return false;
        }

        dirent* dirIt;
        while ((dirIt = readdir(workDir)) != nullptr) {
            if (isValidFileType(dirIt->d_name, extWave)) {
                workFiles.push_back(new LameWrapper(dir, dirIt->d_name));
            }
        }

        return workFiles.size() > 0;
    }